

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O2

void __thiscall
prometheus::detail::MetricsHandler::MetricsHandler(MetricsHandler *this,Registry *registry)

{
  Builder<prometheus::Counter> *pBVar1;
  Family<prometheus::Counter> *pFVar2;
  Counter *pCVar3;
  Builder<prometheus::Summary> *pBVar4;
  Family<prometheus::Summary> *this_00;
  Summary *pSVar5;
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [32];
  _Base_ptr local_a8;
  size_t local_a0;
  undefined1 local_98 [8];
  undefined1 auStack_90 [32];
  size_t local_70;
  Quantile local_58;
  
  (this->super_CivetHandler)._vptr_CivetHandler = (_func_int **)&PTR__MetricsHandler_0013ca68;
  (this->collectables_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->collectables_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->collectables_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->collectables_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->collectables_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->collectables_).
  super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->collectables_).
  super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->collectables_).
  super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BuildCounter();
  std::__cxx11::string::string((string *)local_c8,"exposer_transferred_bytes_total",&local_ea);
  pBVar1 = Builder<prometheus::Counter>::Name
                     ((Builder<prometheus::Counter> *)local_98,(string *)local_c8);
  std::__cxx11::string::string
            ((string *)&local_e8,"Transferred bytes to metrics services",&local_e9);
  pBVar1 = Builder<prometheus::Counter>::Help(pBVar1,&local_e8);
  pFVar2 = Builder<prometheus::Counter>::Register(pBVar1,registry);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_c8);
  Builder<prometheus::Counter>::~Builder((Builder<prometheus::Counter> *)local_98);
  this->bytes_transferred_family_ = pFVar2;
  local_98 = (undefined1  [8])0x0;
  auStack_90._0_8_ = 0.0;
  auStack_90._8_8_ = (_Base_ptr)0x0;
  local_70 = 0;
  auStack_90._16_8_ = (_Base_ptr)auStack_90;
  auStack_90._24_8_ = (_Base_ptr)auStack_90;
  pCVar3 = Family<prometheus::Counter>::Add<>(pFVar2,(Labels *)local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98);
  this->bytes_transferred_ = pCVar3;
  BuildCounter();
  std::__cxx11::string::string((string *)local_c8,"exposer_scrapes_total",&local_ea);
  pBVar1 = Builder<prometheus::Counter>::Name
                     ((Builder<prometheus::Counter> *)local_98,(string *)local_c8);
  std::__cxx11::string::string((string *)&local_e8,"Number of times metrics were scraped",&local_e9)
  ;
  pBVar1 = Builder<prometheus::Counter>::Help(pBVar1,&local_e8);
  pFVar2 = Builder<prometheus::Counter>::Register(pBVar1,registry);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_c8);
  Builder<prometheus::Counter>::~Builder((Builder<prometheus::Counter> *)local_98);
  this->num_scrapes_family_ = pFVar2;
  local_98 = (undefined1  [8])0x0;
  auStack_90._0_8_ = 0.0;
  auStack_90._8_8_ = (_Base_ptr)0x0;
  local_70 = 0;
  auStack_90._16_8_ = (_Base_ptr)auStack_90;
  auStack_90._24_8_ = (_Base_ptr)auStack_90;
  pCVar3 = Family<prometheus::Counter>::Add<>(pFVar2,(Labels *)local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_98);
  this->num_scrapes_ = pCVar3;
  BuildSummary();
  std::__cxx11::string::string((string *)local_c8,"exposer_request_latencies",&local_ea);
  pBVar4 = Builder<prometheus::Summary>::Name
                     ((Builder<prometheus::Summary> *)local_98,(string *)local_c8);
  std::__cxx11::string::string
            ((string *)&local_e8,"Latencies of serving scrape requests, in microseconds",&local_e9);
  pBVar4 = Builder<prometheus::Summary>::Help(pBVar4,&local_e8);
  this_00 = Builder<prometheus::Summary>::Register(pBVar4,registry);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_c8);
  Builder<prometheus::Summary>::~Builder((Builder<prometheus::Summary> *)local_98);
  this->request_latencies_family_ = this_00;
  local_c8._24_8_ = local_c8 + 8;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  local_a0 = 0;
  local_a8 = (_Base_ptr)local_c8._24_8_;
  CKMSQuantiles::Quantile::Quantile((Quantile *)local_98,0.5,0.05);
  CKMSQuantiles::Quantile::Quantile((Quantile *)(auStack_90 + 0x18),0.9,0.01);
  CKMSQuantiles::Quantile::Quantile(&local_58,0.99,0.001);
  __l._M_len = 3;
  __l._M_array = (iterator)local_98;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
            *)&local_e8,__l,(allocator_type *)&local_ea);
  pSVar5 = Family<prometheus::Summary>::
           Add<std::vector<prometheus::detail::CKMSQuantiles::Quantile,std::allocator<prometheus::detail::CKMSQuantiles::Quantile>>>
                     (this_00,(Labels *)local_c8,
                      (vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                       *)&local_e8);
  std::
  _Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~_Vector_base((_Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                   *)&local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_c8);
  this->request_latencies_ = pSVar5;
  return;
}

Assistant:

MetricsHandler::MetricsHandler(Registry& registry)
    : bytes_transferred_family_(
          BuildCounter()
              .Name("exposer_transferred_bytes_total")
              .Help("Transferred bytes to metrics services")
              .Register(registry)),
      bytes_transferred_(bytes_transferred_family_.Add({})),
      num_scrapes_family_(BuildCounter()
                              .Name("exposer_scrapes_total")
                              .Help("Number of times metrics were scraped")
                              .Register(registry)),
      num_scrapes_(num_scrapes_family_.Add({})),
      request_latencies_family_(
          BuildSummary()
              .Name("exposer_request_latencies")
              .Help("Latencies of serving scrape requests, in microseconds")
              .Register(registry)),
      request_latencies_(request_latencies_family_.Add(
          {}, Summary::Quantiles{{0.5, 0.05}, {0.9, 0.01}, {0.99, 0.001}})) {}